

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_builder_hair_mb.cpp
# Opt level: O2

void __thiscall
embree::avx::
BVHNHairMBlurBuilderSAH<4,_embree::CurveNiMB<8>,_embree::LineMi<8>,_embree::PointMi<8>_>::build
          (BVHNHairMBlurBuilderSAH<4,_embree::CurveNiMB<8>,_embree::LineMi<8>,_embree::PointMi<8>_>
           *this)

{
  BVHN<4> *this_00;
  long lVar1;
  size_t sVar2;
  ulong uVar3;
  Set local_1fc;
  Create local_1fb;
  Set local_1fa;
  Create local_1f9;
  mvector<PrimRefMB> local_1f8;
  double local_1d0;
  long local_1c8;
  anon_class_8_1_8991fb9c createLeaf;
  Scene *local_1b8;
  undefined8 uStack_1b0;
  PrimInfoMB pinfo;
  BVHNodeRecordMB4D<embree::NodeRefPtr<4>_> root;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_b8;
  long local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  Scene *pSStack_90;
  Scene **local_88;
  long *plStack_80;
  Create *local_78;
  Set *local_70;
  Create *local_68;
  Set *local_60;
  anon_class_8_1_8991fb9c *local_58;
  long local_50;
  Scene *local_40;
  long local_38;
  Scene *local_30;
  undefined8 uStack_28;
  
  this_00 = *(BVHN<4> **)(this + 0x10);
  lVar1 = *(long *)(this + 0x18);
  sVar2 = *(long *)(lVar1 + 0x2b8) + *(long *)(lVar1 + 0x2c8) + *(long *)(lVar1 + 0x348);
  if (sVar2 == 0) {
    local_b8._0_8_ = 0x7f8000007f800000;
    local_b8._8_8_ = 0x7f8000007f800000;
    local_a8 = 0xff800000ff800000;
    uStack_a0 = 0xff800000ff800000;
    local_98 = 0x7f8000007f800000;
    pSStack_90 = (Scene *)0x7f8000007f800000;
    local_88 = (Scene **)0xff800000ff800000;
    plStack_80 = (long *)0xff800000ff800000;
    BVHN<4>::set(this_00,(NodeRef)0x8,(LBBox3fa *)&local_b8.field_1,0);
  }
  else {
    std::__cxx11::to_string((string *)&root,4);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&pinfo,
                   "avx::BVH",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&root);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &local_b8.field_1,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&pinfo,
                   "HairMBlurBuilderSAH");
    local_1d0 = BVHN<4>::preBuild(this_00,(string *)&local_b8.field_1);
    std::__cxx11::string::~string((string *)&local_b8.field_1);
    std::__cxx11::string::~string((string *)&pinfo);
    std::__cxx11::string::~string((string *)&root);
    local_1f8.alloc.device =
         (MemoryMonitorInterface *)(*(long *)(*(long *)(this + 0x18) + 0x188) + 0x550);
    if (*(long *)(*(long *)(this + 0x18) + 0x188) == 0) {
      local_1f8.alloc.device = (MemoryMonitorInterface *)0x0;
    }
    local_1f8.alloc.hugepages = false;
    uVar3 = sVar2 * 0x50;
    local_1f8.size_active = 0;
    local_1f8.size_alloced = 0;
    local_1f8.items = (PrimRefMB *)0x0;
    (**(local_1f8.alloc.device)->_vptr_MemoryMonitorInterface)(local_1f8.alloc.device,uVar3,0);
    if (uVar3 < 0x1c00000) {
      local_1f8.items = (PrimRefMB *)alignedMalloc(uVar3,0x10);
    }
    else {
      local_1f8.items = (PrimRefMB *)os_malloc(uVar3,&local_1f8.alloc.hugepages);
    }
    local_1f8.size_active = sVar2;
    local_1f8.size_alloced = sVar2;
    createPrimRefArrayMSMBlur
              (&pinfo,*(Scene **)(this + 0x18),MTY_CURVES,sVar2,&local_1f8,
               (BuildProgressMonitor *)(*(long *)(*(long *)(this + 0x10) + 0x68) + 0x260),
               (BBox1f)0x3f80000000000000);
    uVar3 = (ulong)((uint)pinfo.num_time_segments & 7);
    lVar1 = uVar3 * 0x25 + 0x1e;
    if (uVar3 == 0) {
      lVar1 = 0;
    }
    FastAllocator::init_estimate
              ((FastAllocator *)(*(long *)(this + 0x10) + 0x78),
               (pinfo.num_time_segments >> 3) * 0x146 + (pinfo.num_time_segments * 0xe0 >> 4) +
               lVar1);
    for (local_a8 = 0; (8UL >> local_a8 & 1) == 0; local_a8 = local_a8 + 1) {
    }
    local_58 = &createLeaf;
    local_1b8 = *(Scene **)(this + 0x18);
    local_88 = &local_1b8;
    uStack_1b0 = 0;
    local_1c8 = *(long *)(this + 0x10) + 0x78;
    plStack_80 = &local_1c8;
    local_50 = *(long *)(*(long *)(this + 0x10) + 0x68) + 0x260;
    local_b8._0_8_ = 4;
    local_b8._8_8_ = 0x28;
    uStack_a0 = 8;
    local_98 = 8;
    local_78 = &local_1f9;
    local_70 = &local_1fa;
    local_68 = &local_1fb;
    local_60 = &local_1fc;
    lVar1 = *(long *)&(local_1b8->super_AccelN).field_0x188;
    local_38 = lVar1 + 0x550;
    if (lVar1 == 0) {
      local_38 = 0;
    }
    uStack_28 = 0;
    createLeaf.this =
         (BVHNHairMBlurBuilderSAH<4,_embree::CurveNiMB<4>,_embree::LineMi<4>,_embree::PointMi<4>_> *
         )this;
    pSStack_90 = local_1b8;
    local_40 = local_1b8;
    local_30 = local_1b8;
    BVHBuilderHairMSMBlur::
    BuilderT<embree::NodeRefPtr<4>,_embree::avx::VirtualRecalculatePrimRef,_embree::BVHN<4>::CreateAlloc,_embree::AABBNodeMB4D_t<embree::NodeRefPtr<4>,_4>::Create,_embree::AABBNodeMB4D_t<embree::NodeRefPtr<4>,_4>::Set,_embree::OBBNodeMB_t<embree::NodeRefPtr<4>,_4>::Create,_embree::OBBNodeMB_t<embree::NodeRefPtr<4>,_4>::Set,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/embree[P]embree/kernels/bvh/bvh_builder_hair_mb.cpp:62:27),_embree::Scene::BuildProgressMonitorInterface>
    ::operator()(&root,(BuilderT<embree::NodeRefPtr<4>,_embree::avx::VirtualRecalculatePrimRef,_embree::BVHN<4>::CreateAlloc,_embree::AABBNodeMB4D_t<embree::NodeRefPtr<4>,_4>::Create,_embree::AABBNodeMB4D_t<embree::NodeRefPtr<4>,_4>::Set,_embree::OBBNodeMB_t<embree::NodeRefPtr<4>,_4>::Create,_embree::OBBNodeMB_t<embree::NodeRefPtr<4>,_4>::Set,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_kernels_bvh_bvh_builder_hair_mb_cpp:62:27),_embree::Scene::BuildProgressMonitorInterface>
                        *)&local_b8.field_1,&local_1f8,&pinfo);
    BVHN<4>::set(*(BVHN<4> **)(this + 0x10),(NodeRef)root.ref.ptr,&root.lbounds,
                 pinfo.num_time_segments);
    BVHN<4>::cleanup(*(BVHN<4> **)(this + 0x10),(EVP_PKEY_CTX *)root.ref.ptr);
    BVHN<4>::postBuild(*(BVHN<4> **)(this + 0x10),local_1d0);
    sVar2 = local_1f8.size_alloced;
    if (local_1f8.items != (PrimRefMB *)0x0) {
      if (local_1f8.size_alloced * 0x50 < 0x1c00000) {
        alignedFree(local_1f8.items);
      }
      else {
        os_free(local_1f8.items,local_1f8.size_alloced * 0x50,local_1f8.alloc.hugepages);
      }
    }
    if (sVar2 != 0) {
      (**(local_1f8.alloc.device)->_vptr_MemoryMonitorInterface)
                (local_1f8.alloc.device,sVar2 * -0x50,1);
    }
  }
  return;
}

Assistant:

void build() 
      {
        /* fast path for empty BVH */
        const size_t numPrimitives = scene->getNumPrimitives(Geometry::MTY_CURVES,true);
        if (numPrimitives == 0) {
          bvh->set(BVH::emptyNode,empty,0);
          return;
        }

        double t0 = bvh->preBuild(TOSTRING(isa) "::BVH" + toString(N) + "HairMBlurBuilderSAH");

        //profile(1,5,numPrimitives,[&] (ProfileTimer& timer) {

        /* create primref array */
        mvector<PrimRefMB> prims0(scene->device,numPrimitives);
        const PrimInfoMB pinfo = createPrimRefArrayMSMBlur(scene,Geometry::MTY_CURVES,numPrimitives,prims0,bvh->scene->progressInterface);

        /* estimate acceleration structure size */
        const size_t node_bytes = pinfo.num_time_segments*sizeof(typename BVH::AABBNodeMB)/(4*N);
        const size_t leaf_bytes = CurvePrimitive::bytes(pinfo.num_time_segments);
        bvh->alloc.init_estimate(node_bytes+leaf_bytes);
    
        /* settings for BVH build */
        BVHBuilderHairMSMBlur::Settings settings;
        settings.branchingFactor = N;
        settings.maxDepth = BVH::maxBuildDepthLeaf;
        settings.logBlockSize = bsf(CurvePrimitive::max_size());
        settings.minLeafSize = CurvePrimitive::max_size();
        settings.maxLeafSize = CurvePrimitive::max_size();

        /* creates a leaf node */
        auto createLeaf = [&] (const SetMB& prims, const FastAllocator::CachedAllocator& alloc) -> NodeRecordMB4D {

          if (prims.size() == 0)
            return NodeRecordMB4D(BVH::emptyNode,empty,empty);
          
          const unsigned int geomID0 = (*prims.prims)[prims.begin()].geomID();
          if (scene->get(geomID0)->getTypeMask() & Geometry::MTY_POINTS)
            return PointPrimitive::createLeafMB(bvh,prims,alloc);
          else if (scene->get(geomID0)->getCurveBasis() == Geometry::GTY_BASIS_LINEAR)
            return LinePrimitive::createLeafMB(bvh,prims,alloc);
          else
            return CurvePrimitive::createLeafMB(bvh,prims,alloc);
        };

        /* build the hierarchy */
        auto root = BVHBuilderHairMSMBlur::build<NodeRef>
          (scene, prims0, pinfo,
           VirtualRecalculatePrimRef(scene),
           typename BVH::CreateAlloc(bvh),
           typename BVH::AABBNodeMB4D::Create(),
           typename BVH::AABBNodeMB4D::Set(),
           typename BVH::OBBNodeMB::Create(),
           typename BVH::OBBNodeMB::Set(),
           createLeaf,
           bvh->scene->progressInterface,
           settings);
        
        bvh->set(root.ref,root.lbounds,pinfo.num_time_segments);
        
        //});
        
        /* clear temporary data for static geometry */
        bvh->cleanup();
        bvh->postBuild(t0);
      }